

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeakFinder.cpp
# Opt level: O2

void scalarProduct(float scalar,vector<float,_std::allocator<float>_> *in,
                  vector<float,_std::allocator<float>_> *out)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  long lVar4;
  allocator_type local_35;
  float local_34;
  _Vector_base<float,_std::allocator<float>_> local_30;
  
  local_34 = scalar;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_30,
             (long)(in->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(in->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_35);
  std::vector<float,_std::allocator<float>_>::_M_move_assign(out);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_30);
  pfVar1 = (in->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pfVar2 = (in->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pfVar3 = (out->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar4 = 0; (long)pfVar2 - (long)pfVar1 >> 2 != lVar4; lVar4 = lVar4 + 1) {
    pfVar3[lVar4] = pfVar1[lVar4] * local_34;
  }
  return;
}

Assistant:

void scalarProduct(float scalar, std::vector<float> in, std::vector<float>& out)
{
	out = std::vector<float>(in.size());

	for(int i=0; i<in.size(); ++i)
		out[i] = scalar * in[i];
}